

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * testing::TempDir_abi_cxx11_(void)

{
  char *__s;
  size_t sVar1;
  string *psVar2;
  string *in_RDI;
  long lVar3;
  allocator local_49;
  char *local_48 [2];
  allocator local_38 [32];
  
  local_48[0] = "TEST_TMPDIR";
  local_48[1] = "TMPDIR";
  lVar3 = 0;
  do {
    if (lVar3 == 0x10) {
      __s = "/tmp/";
LAB_0013f93e:
      std::__cxx11::string::string((string *)in_RDI,__s,local_38);
      return in_RDI;
    }
    __s = getenv(*(char **)((long)local_48 + lVar3));
    if ((__s != (char *)0x0) && (*__s != '\0')) {
      sVar1 = strlen(__s);
      if (__s[sVar1 - 1] != '/') {
        std::__cxx11::string::string((string *)local_38,__s,&local_49);
        psVar2 = (string *)std::__cxx11::string::append((ulong)local_38,'\x01');
        std::__cxx11::string::string((string *)in_RDI,psVar2);
        std::__cxx11::string::~string((string *)local_38);
        return in_RDI;
      }
      goto LAB_0013f93e;
    }
    lVar3 = lVar3 + 8;
  } while( true );
}

Assistant:

std::string TempDir() {
#if defined(GTEST_CUSTOM_TEMPDIR_FUNCTION_)
  return GTEST_CUSTOM_TEMPDIR_FUNCTION_();
#elif GTEST_OS_WINDOWS || GTEST_OS_WINDOWS_MOBILE
  return GetTempDirFromEnv({"TEST_TMPDIR", "TEMP"}, "\\temp\\", '\\');
#elif GTEST_OS_LINUX_ANDROID
  return GetTempDirFromEnv({"TEST_TMPDIR", "TMPDIR"}, "/data/local/tmp/", '/');
#else
  return GetTempDirFromEnv({"TEST_TMPDIR", "TMPDIR"}, "/tmp/", '/');
#endif
}